

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddr.cpp
# Opt level: O0

size_t axl::io::getSockAddrNetMaskBitCount(sockaddr *addr)

{
  sockaddr_in6 *in_RDI;
  size_t local_8;
  
  if (in_RDI->sin6_family == 2) {
    local_8 = getSockAddrNetMaskBitCount_ip4((sockaddr_in *)in_RDI);
  }
  else if (in_RDI->sin6_family == 10) {
    local_8 = getSockAddrNetMaskBitCount_ip6(in_RDI);
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

size_t
getSockAddrNetMaskBitCount(const sockaddr* addr) {
	switch (addr->sa_family) {
	case AF_INET:
		return getSockAddrNetMaskBitCount_ip4((const sockaddr_in*)addr);

	case AF_INET6:
		return getSockAddrNetMaskBitCount_ip6((const sockaddr_in6*)addr);

	default:
		return 0;
	}
}